

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMalformedImages.cpp
# Opt level: O0

void anon_unknown.dwarf_121fc0::readImage(char *inFileName)

{
  string *name;
  ostream *__a;
  Header *this;
  Box2i *base;
  Array2D<Imf_2_5::Rgba> *this_00;
  char *in_RDI;
  AcesInputFile in;
  int height;
  int width;
  Box2i dw;
  Header h;
  Array2D<Imf_2_5::Rgba> p;
  Box<Imath_2_5::Vec2<int>_> *in_stack_fffffffffffffef8;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff00;
  int numThreads;
  undefined8 in_stack_ffffffffffffff38;
  Compression compression;
  LineOrder in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  V2f *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Header *in_stack_ffffffffffffff60;
  Vec2<float> local_60 [8];
  Array2D<Imf_2_5::Rgba> local_20;
  char *local_8;
  
  compression = (Compression)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_8 = in_RDI;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(&local_20);
  Imath_2_5::Vec2<float>::Vec2(local_60,0.0,0.0);
  Imf_2_5::Header::Header
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             in_stack_ffffffffffffff40,compression);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_stack_ffffffffffffff00);
  name = (string *)std::operator<<((ostream *)&std::cout,"Reading file ");
  __a = std::operator<<((ostream *)name,local_8);
  std::ostream::operator<<(__a,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(char *)name,
             (allocator<char> *)__a);
  numThreads = (int)((ulong)__a >> 0x20);
  Imf_2_5::globalThreadCount();
  Imf_2_5::AcesInputFile::AcesInputFile
            ((AcesInputFile *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),name,
             numThreads);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  this = Imf_2_5::AcesInputFile::header((AcesInputFile *)0x1b7bc8);
  Imf_2_5::Header::operator=
            (in_stack_ffffffffffffff60,
             (Header *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  base = Imf_2_5::Header::dataWindow((Header *)0x1b7bf0);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::resizeErase
            ((Array2D<Imf_2_5::Rgba> *)in_stack_ffffffffffffff60,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  this_00 = (Array2D<Imf_2_5::Rgba> *)Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](&local_20,0);
  Imf_2_5::AcesInputFile::setFrameBuffer
            ((AcesInputFile *)this,(Rgba *)base,(size_t)this_00,(size_t)in_stack_fffffffffffffef8);
  Imf_2_5::AcesInputFile::readPixels
            ((AcesInputFile *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (int)((ulong)name >> 0x20),(int)name);
  Imf_2_5::AcesInputFile::~AcesInputFile((AcesInputFile *)this_00);
  Imf_2_5::Header::~Header(this);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(this_00);
  return;
}

Assistant:

void
readImage (const char inFileName[])
{
	Array2D<Rgba> p;
	Header h;
	Box2i dw;
	int width;
	int height;

	{
		cout << "Reading file " << inFileName << endl;

		AcesInputFile in (inFileName);

		h = in.header();
		dw = h.dataWindow();

		width  = dw.max.x - dw.min.x + 1;
		height = dw.max.y - dw.min.y + 1;
		p.resizeErase (height, width);

		in.setFrameBuffer (&p[0][0] - dw.min.x - dw.min.y * width, 1, width);
		in.readPixels (dw.min.y, dw.max.y);
	}
}